

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall irr::gui::CGUISkin::setSpriteBank(CGUISkin *this,IGUISpriteBank *bank)

{
  _func_int **in_RSI;
  IReferenceCounted *in_RDI;
  
  if (in_RSI != (_func_int **)0x0) {
    IReferenceCounted::grab((IReferenceCounted *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
  }
  if (in_RDI[0xe]._vptr_IReferenceCounted != (_func_int **)0x0) {
    IReferenceCounted::drop(in_RDI);
  }
  in_RDI[0xe]._vptr_IReferenceCounted = in_RSI;
  return;
}

Assistant:

void CGUISkin::setSpriteBank(IGUISpriteBank *bank)
{
	if (bank)
		bank->grab();

	if (SpriteBank)
		SpriteBank->drop();

	SpriteBank = bank;
}